

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O2

int cvsrch(custom_function *funcpt,custom_gradient *funcgrad,double *x,double *f,double *g,
          double *stp,double *s,int N,double *dx,double maxstep,int MAXITER,double eps2,double ftol,
          double gtol,double xtol)

{
  uint uVar1;
  undefined4 uVar2;
  int iVar3;
  void *__ptr;
  ulong uVar4;
  uint uVar5;
  char *__format;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_188;
  double local_180;
  double dgm;
  double fm;
  custom_gradient *local_168;
  double local_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  undefined8 uStack_140;
  double local_130;
  double dgxm;
  double dgym;
  double fxm;
  double fym;
  double local_108;
  double local_100;
  double local_f8;
  double dgx;
  double dgy;
  double fx;
  double fy;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  undefined8 uStack_b0;
  long local_a0;
  double local_98;
  int local_8c;
  double local_88;
  double stx;
  double local_78;
  double sty;
  double *local_68;
  int local_5c;
  double *pdStack_58;
  int brackt;
  double local_50;
  int local_44;
  double local_40;
  uint local_34;
  
  lVar7 = (long)N;
  pdVar6 = g;
  fm = eps2;
  local_168 = funcgrad;
  fym = (double)funcpt;
  fy = maxstep;
  local_d0 = xtol;
  local_c8 = gtol;
  local_98 = ftol;
  pdStack_58 = f;
  local_68 = (double *)malloc(lVar7 * 8);
  __ptr = malloc(lVar7 * 8);
  uVar5 = 0;
  local_a0 = lVar7;
  if ((((0 < lVar7) && (dVar9 = 0.0, 0.0 <= local_d0)) && (0.0 <= local_c8)) &&
     ((0.0 <= local_98 && (0.0 < *stp)))) {
    uVar8 = (ulong)(uint)N;
    for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      dVar9 = dVar9 + dx[uVar4] * s[uVar4] * dx[uVar4] * s[uVar4];
    }
    stx = (double)__ptr;
    if (dVar9 < 0.0) {
      sqrt(dVar9);
    }
    for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      dVar9 = ABS(x[uVar4]);
      if (ABS(x[uVar4]) <= 1.0 / ABS(dx[uVar4])) {
        dVar9 = 1.0 / ABS(dx[uVar4]);
      }
      local_68[uVar4] = s[uVar4] / dVar9;
    }
    dVar9 = array_max_abs(local_68,(int)local_a0);
    dVar11 = 0.0;
    for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      dVar11 = dVar11 + g[uVar4] * s[uVar4];
    }
    uVar5 = 0;
    __ptr = (void *)stx;
    if (dVar11 < 0.0) {
      local_108 = local_98 / dVar9;
      local_5c = 0;
      local_100 = *pdStack_58;
      dVar9 = fy - local_108;
      for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
        *(double *)((long)stx + uVar4 * 8) = x[uVar4];
      }
      local_148 = dVar11 * local_98;
      uStack_140 = 0;
      local_88 = 0.0;
      local_c0 = dVar9 + dVar9;
      local_78 = 0.0;
      local_8c = MAXITER + -1;
      dVar10 = -dVar11 * local_c8;
      uVar2 = 1;
      local_b8 = (double)CONCAT44(local_b8._4_4_,1);
      local_44 = 0;
      uVar5 = 0;
      local_f8 = dVar11;
      dgx = dVar11;
      dgy = local_100;
      fx = local_100;
      do {
        pdVar6 = (double *)CONCAT71((int7)((ulong)pdVar6 >> 8),local_5c == 1);
        local_160 = dVar9;
        do {
          __ptr = (void *)stx;
          if (uVar5 != 0) goto LAB_0013e770;
          local_34 = (uint)pdVar6;
          sty = local_88;
          local_158 = (double)CONCAT44(local_158._4_4_,uVar2);
          if (((ulong)pdVar6 & 1) == 0) {
            dVar9 = *stp;
            local_40 = (dVar9 - local_88) * 4.0 + dVar9;
            local_50 = local_88;
          }
          else {
            local_40 = local_78;
            local_50 = pmin(local_88,local_78);
            local_40 = pmax(sty,local_40);
            dVar9 = *stp;
          }
          dVar9 = pmax(dVar9,local_108);
          *stp = dVar9;
          dVar9 = pmin(dVar9,fy);
          *stp = dVar9;
          if ((local_34 & 1) == 0) {
            if ((local_8c <= local_44) || (local_b8._0_4_ == 0)) goto LAB_0013e2cc;
          }
          else if (((dVar9 <= local_50) ||
                   (((local_40 <= dVar9 || (local_8c <= local_44)) || (local_b8._0_4_ == 0)))) ||
                  (local_40 - local_50 <= local_40 * local_d0)) {
LAB_0013e2cc:
            *stp = sty;
          }
          for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
            x[uVar4] = *stp * s[uVar4] + *(double *)((long)stx + uVar4 * 8);
          }
          dVar9 = (double)(**(code **)fym)(x,local_a0,*(undefined8 *)((long)fym + 8));
          *pdStack_58 = dVar9;
          if (1.79769313486232e+308 <= ABS(dVar9)) {
            __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_0013e75e:
            printf(__format);
            uVar5 = 0xf;
            __ptr = (void *)stx;
            goto LAB_0013e770;
          }
          if (NAN(dVar9)) {
            __format = "Program Exiting as the function returns NaN";
            goto LAB_0013e75e;
          }
          grad_cd((custom_function *)fym,local_168,x,(int)local_a0,dx,fm,g);
          local_188 = 0.0;
          for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
            local_188 = local_188 + g[uVar4] * s[uVar4];
          }
          dVar9 = *stp;
          if ((((local_34 & 1) != 0) && ((dVar9 <= local_50 || (local_40 <= dVar9)))) ||
             (local_b8._0_4_ == 0)) {
            uVar5 = 6;
          }
          else {
            uVar5 = 0;
          }
          dVar13 = dVar9 * local_148 + local_100;
          if (((dVar9 == fy) && (!NAN(dVar9) && !NAN(fy))) &&
             (*pdStack_58 <= dVar13 && local_188 <= local_148)) {
            uVar5 = 5;
          }
          if (((dVar9 == local_108) && (!NAN(dVar9) && !NAN(local_108))) &&
             (local_148 <= local_188 || dVar13 < *pdStack_58)) {
            uVar5 = 4;
          }
          local_44 = local_44 + 1;
          if (MAXITER <= local_44) {
            uVar5 = 3;
          }
          uVar1 = local_34 & 1;
          local_34 = uVar5;
          if ((uVar1 != 0) && (local_40 - local_50 <= local_40 * local_d0)) {
            local_34 = 2;
          }
          dVar9 = *pdStack_58;
          if (dVar9 <= dVar13) {
            if (ABS(local_188) <= dVar10) {
              local_34 = 1;
            }
            uVar2 = 0;
            if (local_158._0_4_ == 1) {
              uStack_150 = 0;
              uStack_b0 = 0;
              local_158 = dVar13;
              local_b8 = local_188;
              dVar9 = pmin(local_98,local_c8);
              if (local_b8 < dVar9 * dVar11) {
                dVar9 = *pdStack_58;
                dVar12 = local_b8;
                dVar13 = local_158;
                goto LAB_0013e513;
              }
              uVar2 = 0;
            }
LAB_0013e67a:
            sty = (double)CONCAT44(sty._4_4_,uVar2);
            iVar3 = cstep(&local_88,&dgy,&local_f8,&local_78,&fx,&dgx,stp,pdStack_58,&local_188,
                          &local_5c,local_50,local_40);
            local_b8 = (double)CONCAT44(local_b8._4_4_,iVar3);
            uVar2 = sty._0_4_;
          }
          else {
            uVar2 = 0;
            dVar12 = local_188;
            if (local_158._0_4_ != 1) goto LAB_0013e67a;
LAB_0013e513:
            if ((dgy < dVar9) || (dVar9 <= dVar13)) {
              uVar2 = 1;
              goto LAB_0013e67a;
            }
            dgm = dVar9 - *stp * local_148;
            dgym = dgy - sty * local_148;
            fxm = fx - local_78 * local_148;
            local_180 = dVar12 - local_148;
            local_130 = local_f8 - local_148;
            dgxm = dgx - local_148;
            iVar3 = cstep(&local_88,&dgym,&local_130,&local_78,&fxm,&dgxm,stp,&dgm,&local_180,
                          &local_5c,local_50,local_40);
            local_b8 = (double)CONCAT44(local_b8._4_4_,iVar3);
            dgy = local_88 * local_148 + dgym;
            fx = local_78 * local_148 + fxm;
            local_f8 = local_130 + local_148;
            dgx = dgxm + local_148;
            uVar2 = 1;
          }
          pdVar6 = (double *)0x0;
          uVar5 = local_34;
        } while (local_5c != 1);
        dVar9 = ABS(local_78 - local_88);
        dVar13 = local_c0 * 0.66;
        local_c0 = local_160;
        if (dVar13 <= dVar9) {
          *stp = (local_78 - local_88) * 0.5 + local_88;
        }
      } while( true );
    }
  }
LAB_0013e770:
  free(local_68);
  free(__ptr);
  return uVar5;
}

Assistant:

int cvsrch(custom_function *funcpt, custom_gradient *funcgrad, double *x, double *f, double *g, double *stp, double *s, int N, double *dx, double maxstep,
	int MAXITER,double eps2,double ftol, double gtol, double xtol) {
	int info,i,siter,nfev;
	int infoc, j, brackt, stage1;
	double dg, dgm, dginit, dgtest, dgx, dgxm, dgy, dgym, finit, ftest1, fm, fx, fxm, fy, fym, p5, p66, stx, sty,
		stmin, stmax, width, width1, xtrapf;
	double nlen,den,rell,stepmin;
	double *rcheck,*wa;

	rcheck = (double*)malloc(sizeof(double)*N);
	wa = (double*)malloc(sizeof(double)*N);

	nlen = 0.0;
	p5 = 0.5;
	p66 = 0.66;
	xtrapf = 4.0;
	info = 0;
	infoc = 1;
	siter = MAXITER;


	if (N <= 0 || *stp <= 0.0 || ftol < 0.0 || gtol < 0.0 || xtol < 0.0) {
		free(rcheck);
		free(wa);
		return info;
	}


	for (i = 0; i < N; ++i) {
		nlen += dx[i] * s[i] * dx[i] * s[i];
	}
	nlen = sqrt(nlen);

	for (i = 0; i < N; ++i) {
		if (fabs(x[i]) > 1.0 / fabs(dx[i])) {
			den = fabs(x[i]);
		}
		else {
			den = 1.0 / fabs(dx[i]);
		}
		rcheck[i] = s[i] / den;
	}

	rell = array_max_abs(rcheck, N);

	stepmin = ftol / rell;

	dginit = 0.0;

	for (j = 0; j < N; ++j) {
		dginit += g[j] * s[j];
	}

	if (dginit >= 0.0) {
		free(rcheck);
		free(wa);
		return info;
	}

	brackt = 0;
	stage1 = 1;
	finit = *f;
	nfev = 0;
	dgtest = ftol*dginit;
	width = maxstep - stepmin;
	width1 = width / 0.5;

	for (j = 0; j < N; ++j) {
		wa[j] = x[j];
	}

	/*     The variables stx, fx, dgx contain the values of the step, 
     function, and directional derivative at the best step.
     The variables sty, fy, dgy contain the value of the step,
     function, and derivative at the other endpoint of
     the interval of uncertainty.
     The variables stp, f, dg contain the values of the step,
     function, and derivative at the current step.
	*/

	stx = 0.0;
	fx = finit;
	dgx = dginit;
	sty = 0.0;
	fy = finit;
	dgy = dginit;

	// Iteration

	while (info == 0) {

		if (brackt == 1) {
			stmin = pmin(stx, sty);
			stmax = pmax(stx, sty);
		} else {
			stmin = stx;
			stmax = *stp + xtrapf*(*stp - stx);
		}

		*stp = pmax(*stp, stepmin);
		*stp = pmin(*stp, maxstep);

		if ((brackt == 1 && (*stp <= stmin || *stp >= stmax)) || nfev >= siter - 1 || infoc == 0 || (brackt == 1 && (stmax - stmin) <= xtol*stmax)) {
			*stp = stx;
		}

		for (j = 0; j < N; ++j) {
			x[j] = wa[j] + *stp * s[j];
		}

		*f = FUNCPT_EVAL(funcpt,x, N);
		if (*f >= DBL_MAX || *f <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(rcheck);
			free(wa);
			return 15;
		}
		if (*f != *f) {
			printf("Program Exiting as the function returns NaN");
			free(rcheck);
			free(wa);
			return 15;
		}
		grad_cd(funcpt,funcgrad, x, N, dx, eps2,g);
		nfev++;


		dg = 0.0;
		for (j = 0; j < N; ++j) {
			dg = dg + g[j]*s[j];
		}	
		ftest1 = finit + *stp * dgtest;

		//       Test for convergence.

		if ((brackt == 1 && (*stp <= stmin || *stp >= stmax)) || infoc == 0) {
			info = 6;
		}

		if (*stp == maxstep && *f <= ftest1 && dg <= dgtest) {
			info = 5;
		}

		if (*stp == stepmin && (*f > ftest1 || dg >= dgtest)) {
			info = 4;
		}

		if (nfev >= siter) {
			info = 3;
		}

		if (brackt == 1 && ((stmax - stmin) <= xtol*stmax)) {
			info = 2;
		}

		if (*f <= ftest1 && fabs(dg) <= gtol*(-dginit)) {
			info = 1;
		}

		if (stage1 == 1 && *f <= ftest1 && dg >= pmin(ftol, gtol)*dginit) {
			stage1 = 0;
		}


		/*
		A modified function is used to predict the step only if
        we have not obtained a step for which the modified
        function has a nonpositive function value and nonnegative
        derivative, and if a lower function value has been
        obtained but the decrease is not sufficient.
		*/
		if (stage1 == 1 && *f <= fx && *f > ftest1) {

			fm = *f - *stp*dgtest;
			fxm = fx - stx*dgtest;
			fym = fy - sty*dgtest;
			dgm = dg - dgtest;
			dgxm = dgx - dgtest;
			dgym = dgy - dgtest;

			infoc = cstep(&stx, &fxm, &dgxm, &sty, &fym, &dgym, stp, &fm, &dgm, &brackt, stmin, stmax);

			fx = fxm + stx*dgtest;
			fy = fym + sty*dgtest;
			dgx = dgxm + dgtest;
			dgy = dgym + dgtest;
		} else {
			
			infoc = cstep(&stx, &fx, &dgx, &sty, &fy, &dgy, stp, f, &dg, &brackt, stmin, stmax);
		}

		if (brackt == 1) {
			if (fabs(sty - stx) >= p66*width1) {
				*stp = stx + p5*(sty - stx);
			}
			width1 = width;
			width = fabs(sty - stx);
		}

	}

	free(rcheck);
	free(wa);

	return info;
}